

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfscanf.c
# Opt level: O0

int vfscanf(FILE *__s,char *__format,__gnuc_va_list __arg)

{
  int iVar1;
  uint __c;
  int iVar2;
  __va_list_tag *p_Var3;
  int local_90;
  int c;
  char *rc;
  _PDCLIB_status_t status;
  __va_list_tag *arg_local;
  char *format_local;
  FILE *stream_local;
  
  rc._0_4_ = 0;
  rc._4_4_ = 0;
  status.base = 0;
  status.flags = 0;
  status.n = 0;
  status.i = 0;
  status.current = 0;
  status.s = (char *)0x0;
  status.width._0_4_ = 0xffffffff;
  status._48_8_ = __s;
  status.arg[0].reg_save_area = __arg;
  mtx_lock((mtx_t *)&__s->_IO_save_base);
  iVar1 = _PDCLIB_prepread((_PDCLIB_file_t *)__s);
  if (iVar1 != -1) {
    if ((__s->_IO_read_base == __s->_IO_write_base) && (__s->_IO_buf_base == (char *)0x0)) {
      local_90 = _PDCLIB_fillbuffer((_PDCLIB_file_t *)__s);
    }
    else {
      local_90 = 0;
    }
    if (local_90 != -1) {
      status.arg[0].overflow_arg_area = *(void **)((long)status.arg[0].reg_save_area + 0x10);
      status.stream = *status.arg[0].reg_save_area;
      status.arg[0]._0_8_ = *(undefined8 *)((long)status.arg[0].reg_save_area + 8);
      arg_local = (__va_list_tag *)__format;
      do {
        while( true ) {
          if ((char)arg_local->gp_offset == '\0') goto LAB_0010348f;
          if (((char)arg_local->gp_offset == '%') &&
             (p_Var3 = (__va_list_tag *)_PDCLIB_scan((char *)arg_local,(_PDCLIB_status_t *)&rc),
             p_Var3 != arg_local)) break;
          iVar1 = isspace((uint)(byte)arg_local->gp_offset);
          if (iVar1 == 0) {
            iVar1 = getc(__s);
            if ((iVar1 != (char)arg_local->gp_offset) || (iVar2 = feof(__s), iVar2 != 0)) {
              iVar2 = feof(__s);
              if ((iVar2 == 0) && (iVar2 = ferror(__s), iVar2 == 0)) {
                ungetc(iVar1,__s);
              }
              else if (status._0_8_ == 0) {
                mtx_unlock((mtx_t *)&__s->_IO_save_base);
                return -1;
              }
              mtx_unlock((mtx_t *)&__s->_IO_save_base);
              return status.base;
            }
            status.n = status.n + 1;
          }
          else {
            while( true ) {
              __c = getc(__s);
              iVar1 = isspace(__c & 0xff);
              if (iVar1 == 0) break;
              status.n = status.n + 1;
            }
            iVar1 = feof(__s);
            if (iVar1 == 0) {
              ungetc(__c,__s);
            }
          }
          arg_local = (__va_list_tag *)((long)&arg_local->gp_offset + 1);
        }
        arg_local = p_Var3;
      } while (p_Var3 != (__va_list_tag *)0x0);
LAB_0010348f:
      mtx_unlock((mtx_t *)&__s->_IO_save_base);
      return status.base;
    }
  }
  mtx_unlock((mtx_t *)&__s->_IO_save_base);
  return -1;
}

Assistant:

int vfscanf( FILE * _PDCLIB_restrict stream, const char * _PDCLIB_restrict format, va_list arg )
{
    /* TODO: This function should interpret format as multibyte characters.  */
    struct _PDCLIB_status_t status;
    status.base = 0;
    status.flags = 0;
    status.n = 0;
    status.i = 0;
    status.current = 0;
    status.s = NULL;
    status.width = 0;
    status.prec = EOF;
    status.stream = stream;

    _PDCLIB_LOCK( stream->mtx );

    if ( _PDCLIB_prepread( stream ) == EOF || _PDCLIB_CHECKBUFFER( stream ) == EOF )
    {
        _PDCLIB_UNLOCK( stream->mtx );
        return EOF;
    }

    va_copy( status.arg, arg );

    while ( *format != '\0' )
    {
        const char * rc;

        if ( ( *format != '%' ) || ( ( rc = _PDCLIB_scan( format, &status ) ) == format ) )
        {
            int c;

            /* No conversion specifier, match verbatim */
            if ( isspace( (unsigned char)*format ) )
            {
                /* Whitespace char in format string: Skip all whitespaces */
                /* No whitespaces in input does not result in matching error */
                while ( isspace( (unsigned char)( c = getc( stream ) ) ) )
                {
                    ++status.i;
                }

                if ( ! feof( stream ) )
                {
                    ungetc( c, stream );
                }
            }
            else
            {
                /* Non-whitespace char in format string: Match verbatim */
                if ( ( ( c = getc( stream ) ) != *format ) || feof( stream ) )
                {
                    /* Matching error */
                    if ( ! feof( stream ) && ! ferror( stream ) )
                    {
                        ungetc( c, stream );
                    }
                    else if ( status.n == 0 )
                    {
                        _PDCLIB_UNLOCK( stream->mtx );
                        return EOF;
                    }

                    _PDCLIB_UNLOCK( stream->mtx );
                    return status.n;
                }
                else
                {
                    ++status.i;
                }
            }

            ++format;
        }
        else
        {
            /* NULL return code indicates matching error */
            if ( rc == NULL )
            {
                break;
            }

            /* Continue parsing after conversion specifier */
            format = rc;
        }
    }

    va_end( status.arg );
    _PDCLIB_UNLOCK( stream->mtx );
    return status.n;
}